

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalCentreOfPressureAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rLocation) [3])

{
  pointer pVVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  uint PlateIndex;
  scoped_lock Lock;
  array<double,_3UL> local_e0;
  array<double,_3UL> WorldTranslation;
  array<double,_3UL> LocationVector;
  array<double,_3UL> WorldLocationVector;
  array<double,_9UL> WorldRotation;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>(o_rLocation);
  EVar3 = GetCentreOfPressure(this,i_PlateID,i_Subsample,&LocationVector);
  if (EVar3 == Success) {
    bVar2 = ForcePlateDeviceIndex(this,i_PlateID,&PlateIndex);
    if (bVar2) {
      uVar4 = (ulong)PlateIndex;
      pVVar1 = (this->m_LatestFrame).m_ForcePlates.
               super__Vector_base<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<float_const*,double*>
                (pVVar1[uVar4].m_WorldRotation,pVVar1[uVar4].m_Bounds,WorldRotation._M_elems);
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<float_const*,double*>
                (pVVar1[uVar4].m_WorldTranslation,pVVar1[uVar4].m_WorldRotation,
                 WorldTranslation._M_elems);
      ClientUtils::operator/=(&WorldTranslation,1000.0);
      ClientUtils::operator*(&local_e0,&WorldRotation,&LocationVector);
      ClientUtils::operator+(&local_e0,&WorldTranslation);
      CopyAndTransformT(this,WorldLocationVector._M_elems,o_rLocation);
      EVar3 = Success;
    }
    else {
      EVar3 = Unknown;
    }
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar3;
}

Assistant:

Result::Enum VClient::GetGlobalCentreOfPressureAtSample( const unsigned int i_PlateID,
                                                 const unsigned int i_Subsample, 
                                                 double ( & o_rLocation )[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rLocation );

  std::array< double, 3 > LocationVector;
  Result::Enum Result = GetCentreOfPressure( i_PlateID, i_Subsample, LocationVector );

  if( Result == Result::Success )
  {
    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldTranslation;
    std::copy( rForcePlate.m_WorldTranslation, rForcePlate.m_WorldTranslation + 3, WorldTranslation.begin() );

    // Force Plate Info is in mm.  Result CoP is in meters.
    WorldTranslation /= 1000.0;

    std::array< double, 3 > WorldLocationVector;

    WorldLocationVector = WorldRotation * LocationVector + WorldTranslation;

    CopyAndTransformT( WorldLocationVector.data(), o_rLocation );
  }

  return Result;
}